

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_TypeRules.h
# Opt level: O0

int64_t soul::TypeRules::checkAndGetArrayIndex<soul::AST::Context&>
                  (Context *errorContext,Value *index)

{
  Value *this;
  bool bVar1;
  Type *sizeType;
  int64_t iVar2;
  CompileMessage local_50;
  Value *local_18;
  Value *index_local;
  Context *errorContext_local;
  
  local_18 = index;
  index_local = (Value *)errorContext;
  sizeType = soul::Value::getType(index);
  bVar1 = arraySizeTypeIsOK(sizeType);
  this = index_local;
  if (!bVar1) {
    Errors::nonIntegerArrayIndex<>();
    AST::Context::throwError((Context *)this,&local_50,false);
  }
  iVar2 = soul::Value::getAsInt64(local_18);
  return iVar2;
}

Assistant:

static int64_t checkAndGetArrayIndex (Thrower&& errorContext, const Value& index)
    {
        if (! arraySizeTypeIsOK (index.getType()))
            errorContext.throwError (Errors::nonIntegerArrayIndex());

        return index.getAsInt64();
    }